

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_rem_arm(float128 a,float128 b,float_status *status)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  char cVar5;
  uint64_t zSig1;
  long lVar6;
  uint64_t zSig0;
  ulong uVar7;
  ulong uVar8;
  ulong b_00;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  int32_t bExp;
  uint64_t term1;
  uint64_t term2;
  int32_t aExp;
  uint64_t term0;
  uint local_94;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint local_70;
  uint local_6c;
  uint64_t local_68;
  uint64_t local_60;
  ulong local_58;
  uint64_t local_50;
  ulong local_48;
  float_status *local_40;
  ulong local_38;
  
  local_60 = b.low;
  uVar2 = a.low;
  uVar7 = a.high & 0xffffffffffff;
  uVar9 = a.high._6_2_ & 0x7fff;
  local_58 = b.high & 0xffffffffffff;
  local_94 = b.high._6_2_ & 0x7fff;
  local_6c = uVar9;
  local_50 = uVar2;
  local_48 = uVar7;
  if (uVar9 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         uVar2 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_60 == 0 || local_94 != 0x7fff)) {
LAB_0050f289:
      status->float_exception_flags = status->float_exception_flags | 1;
      return (float128)(ZEXT816(0x7fff800000000000) << 0x40);
    }
LAB_0050f0fa:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) goto LAB_0050f289;
      normalizeFloat128Subnormal(local_58,local_60,(int32_t *)&local_94,&local_58,&local_60);
    }
    else if (local_94 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) {
        return a;
      }
      goto LAB_0050f0fa;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar2 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar7,uVar2,(int32_t *)&local_6c,&local_48,&local_50);
      uVar9 = local_6c;
    }
    iVar10 = uVar9 - local_94;
    if (-2 < iVar10) {
      bVar4 = iVar10 == -1 ^ 0xf;
      uVar8 = local_50 << bVar4;
      uVar12 = local_50 >> ((iVar10 == -1) + 0x31U & 0x3f) | (local_48 | 0x1000000000000) << bVar4;
      local_80 = local_60 * 0x8000;
      b_00 = local_58 << 0xf | local_60 >> 0x31 | 0x8000000000000000;
      uVar7 = (ulong)(local_80 <= uVar8 && uVar12 == b_00 || b_00 < uVar12);
      local_70 = local_94;
      if (local_80 <= uVar8 && uVar12 == b_00 || b_00 < uVar12) {
        bVar13 = uVar8 < local_80;
        uVar8 = uVar8 + local_60 * -0x8000;
        uVar12 = (uVar12 - b_00) - (ulong)bVar13;
      }
      local_90 = local_60 >> 0x31;
      local_40 = status;
      local_38 = a.high;
      for (; iVar1 = iVar10 + -0x40, 0 < iVar1; iVar10 = iVar10 + -0x3d) {
        uVar2 = estimateDiv128To64(uVar12,uVar8,b_00);
        uVar7 = uVar2 - 4;
        if (uVar2 < 4) {
          uVar7 = 0;
        }
        mul128By64To192(b_00,local_80,uVar7,&local_68,&local_88,&local_78);
        uVar11 = uVar8 >> 3;
        uVar3 = local_68 << 0x3d | local_88 >> 3;
        local_78 = local_78 >> 3 | local_88 << 0x3d;
        uVar8 = -local_78;
        uVar12 = ((uVar12 << 0x3d | uVar11) - uVar3) - (ulong)(local_78 != 0);
        local_88 = uVar3;
      }
      if (iVar1 < -0x3f) {
        uVar8 = uVar8 >> 0xc | uVar12 << 0x34;
        uVar2 = uVar12 >> 0xc;
        uVar11 = local_90 << 0x34 | local_80 >> 0xc;
      }
      else {
        uVar2 = estimateDiv128To64(uVar12,uVar8,b_00);
        uVar7 = 0;
        if (3 < uVar2) {
          uVar7 = uVar2 - 4;
        }
        cVar5 = (char)iVar10;
        uVar7 = uVar7 >> (-cVar5 & 0x3fU);
        uVar11 = local_90 << 0x34 | local_80 >> 0xc;
        bVar4 = cVar5 - 0xc;
        if (iVar1 < -0x34) {
          uVar3 = uVar8 >> (0xcU - cVar5 & 0x3f) | uVar12 << (bVar4 & 0x3f);
          uVar12 = uVar12 >> (0xcU - cVar5 & 0x3f);
        }
        else {
          uVar3 = uVar8 << (bVar4 & 0x3f);
          if (iVar10 != 0xc) {
            uVar12 = uVar12 << (bVar4 & 0x3f) | uVar8 >> (0x4cU - cVar5 & 0x3f);
          }
        }
        local_90 = uVar11;
        mul128By64To192(b_00 >> 0xc,uVar11,uVar7,&local_68,&local_88,&local_78);
        uVar8 = uVar3 - local_78;
        uVar2 = (uVar12 - local_88) - (ulong)(uVar3 < local_78);
      }
      zSig1 = uVar8 + uVar11;
      uVar12 = uVar8 * 2 + uVar11;
      uVar7 = uVar7 - 1;
      do {
        zSig0 = uVar2;
        uVar12 = uVar12 + uVar11 * -2;
        zSig1 = zSig1 - uVar11;
        uVar7 = uVar7 + 1;
        bVar13 = uVar8 < uVar11;
        uVar8 = uVar8 - uVar11;
        uVar2 = (zSig0 - (b_00 >> 0xc)) - (ulong)bVar13;
      } while (-1 < (long)uVar2);
      lVar6 = uVar2 + zSig0 + (ulong)(uVar12 < uVar8);
      if (((-1 < lVar6) && ((uVar7 & 1) != 0 || (lVar6 != 0 || uVar12 != 0))) ||
         (uVar2 = zSig0, uVar8 = zSig1, (long)zSig0 < 0)) {
        zSig1 = -uVar8;
        zSig0 = -uVar2 - (ulong)(uVar8 != 0);
      }
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar2 >> 0x38) ^ (byte)(local_38 >> 0x38)) >> 7,local_70 - 4,
                     zSig0,zSig1,local_40);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}